

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_snapshot_close(snap_handle *shandle,filemgr *file)

{
  uint16_t uVar1;
  avl_node *paVar2;
  list_elem *plVar3;
  avl_node *in_RSI;
  avl_tree *in_RDI;
  wal_txn_wrapper *active_txn;
  list_elem *e_next;
  list_elem *e;
  wal_item *item;
  avl_node *nexta;
  avl_node *a;
  undefined8 in_stack_ffffffffffffffb8;
  atomic<unsigned_short> *in_stack_ffffffffffffffc0;
  list_elem *local_38;
  avl_node *local_20;
  
  uVar1 = atomic_decr_uint16_t
                    (in_stack_ffffffffffffffc0,
                     (memory_order)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if ((uVar1 == 0) &&
     ((((ulong)in_RDI[3].root & 0x1000000) != 0 || (in_RDI[2].root == (avl_node *)0x0)))) {
    local_20 = avl_first(in_RDI + 0xc);
    while (local_20 != (avl_node *)0x0) {
      paVar2 = avl_next(local_20);
      avl_remove(in_RDI,in_RSI);
      free(local_20[-3].left[1].parent);
      free(local_20[-3].left);
      free(&local_20[-5].right);
      local_20 = paVar2;
    }
    local_38 = list_begin((list *)&in_RDI[5].aux);
    while (local_38 != (list_elem *)0x0) {
      plVar3 = list_next(local_38);
      free(local_38);
      local_38 = plVar3;
    }
    free(in_RDI);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snapshot_close(struct snap_handle *shandle,
                              struct filemgr *file)
{
    if (!atomic_decr_uint16_t(&shandle->ref_cnt_kvs)) {
        struct avl_node *a, *nexta;
        if (!shandle->is_persisted_snapshot &&
            shandle->snap_tag_idx) { // the KVS did have items in WAL..
            return FDB_RESULT_SUCCESS;
        }
        for (a = avl_first(&shandle->key_tree);
             a; a = nexta) {
            struct wal_item *item = _get_entry(a, struct wal_item, avl_keysnap);
            nexta = avl_next(a);
            avl_remove(&shandle->key_tree, &item->avl_keysnap);
            free(item->header->key);
            free(item->header);
            free(item);
        }
        for (struct list_elem *e = list_begin(&shandle->active_txn_list); e;) {
            struct list_elem *e_next = list_next(e);
            struct wal_txn_wrapper *active_txn = _get_entry(e,
                                                   struct wal_txn_wrapper, le);
            free(active_txn);
            e = e_next;
        }
        free(shandle);
    }
    return FDB_RESULT_SUCCESS;
}